

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O3

int coda_pcre2_substring_get_byname_8
              (pcre2_match_data_8 *match_data,PCRE2_SPTR8 stringname,PCRE2_UCHAR8 **stringptr,
              size_t *sizeptr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ushort uVar4;
  PCRE2_SPTR8 last;
  PCRE2_SPTR8 first;
  ushort *local_28;
  ushort *local_20;
  
  uVar3 = 0xffffffd7;
  if (((match_data->matchedby != '\x01') &&
      (uVar1 = coda_pcre2_substring_nametable_scan_8
                         (match_data->code,stringname,(PCRE2_SPTR8 *)&local_20,
                          (PCRE2_SPTR8 *)&local_28), uVar3 = uVar1, -1 < (int)uVar1)) &&
     (uVar3 = 0xffffffca, local_20 <= local_28)) {
    do {
      uVar4 = *local_20 << 8 | *local_20 >> 8;
      if ((uVar4 < match_data->oveccount) &&
         (uVar3 = 0xffffffc9, match_data->ovector[(ulong)uVar4 * 2] != 0xffffffffffffffff)) {
        iVar2 = coda_pcre2_substring_get_bynumber_8(match_data,(uint)uVar4,stringptr,sizeptr);
        return iVar2;
      }
      local_20 = (ushort *)((long)local_20 + (ulong)uVar1);
    } while (local_20 <= local_28);
  }
  return uVar3;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_get_byname(pcre2_match_data *match_data,
  PCRE2_SPTR stringname, PCRE2_UCHAR **stringptr, PCRE2_SIZE *sizeptr)
{
PCRE2_SPTR first, last, entry;
int failrc, entrysize;
if (match_data->matchedby == PCRE2_MATCHEDBY_DFA_INTERPRETER)
  return PCRE2_ERROR_DFA_UFUNC;
entrysize = pcre2_substring_nametable_scan(match_data->code, stringname,
  &first, &last);
if (entrysize < 0) return entrysize;
failrc = PCRE2_ERROR_UNAVAILABLE;
for (entry = first; entry <= last; entry += entrysize)
  {
  uint32_t n = GET2(entry, 0);
  if (n < match_data->oveccount)
    {
    if (match_data->ovector[n*2] != PCRE2_UNSET)
      return pcre2_substring_get_bynumber(match_data, n, stringptr, sizeptr);
    failrc = PCRE2_ERROR_UNSET;
    }
  }
return failrc;
}